

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AActor_CountProximity
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double distance_00;
  AActor *origin;
  PClass *this;
  int val;
  VMValue *pVVar1;
  AActor *pAVar2;
  bool bVar3;
  bool local_66;
  bool local_63;
  AActor *mobj;
  int ptr;
  int flags;
  double distance;
  MetaClass *classname;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numret < 1) {
    param_local._4_4_ = 0;
  }
  else {
    if (numparam < 1) {
      __assert_fail("(paramnum) < numparam",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x2c9,
                    "int AF_AActor_CountProximity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    bVar3 = false;
    if (((param->field_0).field_3.Type == '\x03') &&
       (bVar3 = true, (param->field_0).field_1.atag != 1)) {
      bVar3 = (param->field_0).field_1.a == (void *)0x0;
    }
    if (!bVar3) {
      __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x2c9,
                    "int AF_AActor_CountProximity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    origin = (AActor *)(param->field_0).field_1.a;
    local_63 = true;
    if (origin != (AActor *)0x0) {
      local_63 = DObject::IsKindOf((DObject *)origin,AActor::RegistrationInfo.MyClass);
    }
    if (local_63 == false) {
      __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x2c9,
                    "int AF_AActor_CountProximity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    if (numparam < 2) {
      __assert_fail("(paramnum) < numparam",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x2ca,
                    "int AF_AActor_CountProximity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    bVar3 = false;
    if ((param[1].field_0.field_3.Type == '\x03') &&
       (bVar3 = true, param[1].field_0.field_1.atag != 1)) {
      bVar3 = param[1].field_0.field_1.a == (void *)0x0;
    }
    if (!bVar3) {
      __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x2ca,
                    "int AF_AActor_CountProximity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    this = (PClass *)param[1].field_0.field_1.a;
    local_66 = true;
    if (this != (PClass *)0x0) {
      local_66 = PClass::IsDescendantOf(this,AActor::RegistrationInfo.MyClass);
    }
    if (local_66 == false) {
      __assert_fail("classname == NULL || classname->IsDescendantOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x2ca,
                    "int AF_AActor_CountProximity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    if (numparam < 3) {
      __assert_fail("(paramnum) < numparam",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x2cb,
                    "int AF_AActor_CountProximity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    if (param[2].field_0.field_3.Type != '\x01') {
      __assert_fail("param[paramnum].Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x2cb,
                    "int AF_AActor_CountProximity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    distance_00 = param[2].field_0.f;
    if (numparam < 4) {
      pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
      if ((pVVar1->field_0).field_3.Type != '\0') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x2cc,
                      "int AF_AActor_CountProximity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
      mobj._4_4_ = (pVVar1->field_0).i;
    }
    else {
      if (param[3].field_0.field_3.Type != '\0') {
        __assert_fail("(param[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x2cc,
                      "int AF_AActor_CountProximity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      mobj._4_4_ = param[3].field_0.i;
    }
    if (numparam < 5) {
      pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
      if ((pVVar1->field_0).field_3.Type != '\0') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x2cd,
                      "int AF_AActor_CountProximity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
      mobj._0_4_ = (pVVar1->field_0).i;
    }
    else {
      if (param[4].field_0.field_3.Type != '\0') {
        __assert_fail("(param[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x2cd,
                      "int AF_AActor_CountProximity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      mobj._0_4_ = param[4].field_0.i;
    }
    pAVar2 = COPY_AAPTR(origin,(int)mobj);
    if (pAVar2 == (AActor *)0x0) {
      VMReturn::SetInt(ret,0);
    }
    else {
      val = P_Thing_CheckProximity(origin,this,distance_00,0,mobj._4_4_,(int)mobj,true);
      VMReturn::SetInt(ret,val);
    }
    param_local._4_4_ = 1;
  }
  return param_local._4_4_;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, CountProximity)
{
	if (numret > 0)
	{
		PARAM_SELF_PROLOGUE(AActor);
		PARAM_CLASS(classname, AActor);
		PARAM_FLOAT(distance);
		PARAM_INT_DEF(flags);
		PARAM_INT_DEF(ptr);

		AActor *mobj = COPY_AAPTR(self, ptr);
		if (mobj == nullptr)
		{
			ret->SetInt(0);
		}
		else
		{
			ret->SetInt(P_Thing_CheckProximity(self, classname, distance, 0, flags, ptr, true));
		}
		return 1;
	}
	return 0;
}